

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptutil.cpp
# Opt level: O2

void __thiscall
ScriptUtil_GetP2wshLockingScriptTest_Test::TestBody(ScriptUtil_GetP2wshLockingScriptTest_Test *this)

{
  _func_int **pp_Var1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  pointer redeem_script;
  initializer_list<ScriptUtil_ScriptTestVector> __l;
  allocator_type local_27f;
  allocator local_27e;
  allocator local_27d;
  allocator local_27c;
  allocator local_27b;
  allocator local_27a;
  allocator local_279;
  string local_278;
  ByteData256 script_hash;
  AssertionResult gtest_ar_1;
  Script local_210;
  vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_> test_vectors;
  string local_1c0;
  string local_1a0;
  Script actual;
  Script local_148;
  Script local_110;
  Script local_d8;
  Script local_a0;
  Script local_68;
  
  std::__cxx11::string::string
            ((string *)&local_210,"01000111022222033333330244440155026666037777770288880199",
             &local_279);
  cfd::core::Script::Script(&actual,(string *)&local_210);
  std::__cxx11::string::string
            ((string *)&local_278,
             "002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437",&local_27a);
  cfd::core::Script::Script(&local_148,&local_278);
  std::__cxx11::string::string
            ((string *)&script_hash,"76a914edaf2414751239b72b653ea004adc310a3522e3788ac",&local_27b)
  ;
  cfd::core::Script::Script(&local_110,(string *)&script_hash);
  std::__cxx11::string::string
            ((string *)&gtest_ar_1,
             "002049672615b13c511f9cef005d2290211c5924e28da4d68f5a8c6dfd1f108bf388",&local_27c);
  cfd::core::Script::Script(&local_d8,(string *)&gtest_ar_1);
  std::__cxx11::string::string
            ((string *)&local_1a0,"0014edaf2414751239b72b653ea004adc310a3522e37",&local_27d);
  cfd::core::Script::Script(&local_a0,&local_1a0);
  std::__cxx11::string::string
            ((string *)&local_1c0,
             "0020c1a9921421f2ac0e76533e25ca211e6a1f9465bdf9931f5e9039dbdfdace0fa4",&local_27e);
  cfd::core::Script::Script(&local_68,&local_1c0);
  __l._M_len = 3;
  __l._M_array = (iterator)&actual;
  std::vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_>::vector
            (&test_vectors,__l,&local_27f);
  lVar3 = 0xe0;
  do {
    ScriptUtil_ScriptTestVector::~ScriptUtil_ScriptTestVector
              ((ScriptUtil_ScriptTestVector *)((long)&actual._vptr_Script + lVar3));
    lVar3 = lVar3 + -0x70;
  } while (lVar3 != -0x70);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&script_hash);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_210);
  cfd::core::Script::Script(&actual);
  for (redeem_script =
            test_vectors.
            super__Vector_base<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_>
            ._M_impl.super__Vector_impl_data._M_start;
      redeem_script !=
      test_vectors.
      super__Vector_base<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_>.
      _M_impl.super__Vector_impl_data._M_finish; redeem_script = redeem_script + 1) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        cfd::core::ScriptUtil::CreateP2wshLockingScript
                  (&local_210,&redeem_script->input_redeem_script);
        cfd::core::Script::operator=(&actual,&local_210);
        cfd::core::Script::~Script(&local_210);
      }
    }
    else {
      testing::Message::Message((Message *)&local_210);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_278,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x9f,
                 "Expected: (actual = ScriptUtil::CreateP2wshLockingScript(test_vector.input_redeem_script)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_278,(Message *)&local_210);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_278);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_210);
    }
    cfd::core::Script::GetHex_abi_cxx11_((string *)&local_210,&actual);
    pp_Var1 = local_210._vptr_Script;
    cfd::core::Script::GetHex_abi_cxx11_(&local_278,&redeem_script->expect_locking_script);
    testing::internal::CmpHelperSTREQ
              ((internal *)&script_hash,"actual.GetHex().c_str()",
               "test_vector.expect_locking_script.GetHex().c_str()",(char *)pp_Var1,
               local_278._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_210);
    if ((char)script_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_210);
      pcVar4 = "";
      if (script_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        pcVar4 = *(char **)script_hash.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_278,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0xa0,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_278,(Message *)&local_210);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_278);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_210);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&script_hash.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
    cfd::core::HashUtil::Sha256(&script_hash,&redeem_script->input_redeem_script);
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        cfd::core::ScriptUtil::CreateP2wshLockingScript(&local_210,&script_hash);
        cfd::core::Script::operator=(&actual,&local_210);
        cfd::core::Script::~Script(&local_210);
      }
    }
    else {
      testing::Message::Message((Message *)&local_210);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_278,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0xa2,
                 "Expected: (actual = ScriptUtil::CreateP2wshLockingScript(script_hash)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_278,(Message *)&local_210);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_278);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_210);
    }
    cfd::core::Script::GetHex_abi_cxx11_((string *)&local_210,&actual);
    pp_Var1 = local_210._vptr_Script;
    cfd::core::Script::GetHex_abi_cxx11_(&local_278,&redeem_script->expect_locking_script);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_1,"actual.GetHex().c_str()",
               "test_vector.expect_locking_script.GetHex().c_str()",(char *)pp_Var1,
               local_278._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_210);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_210);
      pcVar4 = "";
      if (gtest_ar_1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_278,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0xa3,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_278,(Message *)&local_210);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_278);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_210);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&script_hash);
  }
  cfd::core::Script::~Script(&actual);
  std::vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_>::~vector
            (&test_vectors);
  return;
}

Assistant:

TEST(ScriptUtil, GetP2wshLockingScriptTest) {
  const std::vector<ScriptUtil_ScriptTestVector> test_vectors = {
    {
      // 00 11 2222 333333 4444 55 6666 777777 8888 99
      Script("01000111022222033333330244440155026666037777770288880199"),
      Script("002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437")
    },
    {
      // p2pkh locking script
      Script("76a914edaf2414751239b72b653ea004adc310a3522e3788ac"),
      Script("002049672615b13c511f9cef005d2290211c5924e28da4d68f5a8c6dfd1f108bf388")
    },
    {
      // p2wpkh locking script
      Script("0014edaf2414751239b72b653ea004adc310a3522e37"),
      Script("0020c1a9921421f2ac0e76533e25ca211e6a1f9465bdf9931f5e9039dbdfdace0fa4")
    },
  };

  Script actual;
  for (const ScriptUtil_ScriptTestVector& test_vector : test_vectors) {
    EXPECT_NO_THROW((actual = ScriptUtil::CreateP2wshLockingScript(test_vector.input_redeem_script)));
    EXPECT_STREQ(actual.GetHex().c_str(), test_vector.expect_locking_script.GetHex().c_str());
    ByteData256 script_hash = HashUtil::Sha256(test_vector.input_redeem_script);
    EXPECT_NO_THROW((actual = ScriptUtil::CreateP2wshLockingScript(script_hash)));
    EXPECT_STREQ(actual.GetHex().c_str(), test_vector.expect_locking_script.GetHex().c_str());
  }
}